

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O0

any __thiscall
peg::Action::TypeAdaptor_csv<std::pair<char32_t,_char32_t>_>::operator()
          (TypeAdaptor_csv<std::pair<char32_t,_char32_t>_> *this,SemanticValues *sv,any *param_2)

{
  function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)> local_48;
  any *param_2_local;
  SemanticValues *sv_local;
  TypeAdaptor_csv<std::pair<char32_t,_char32_t>_> *this_local;
  
  param_2_local = param_2;
  sv_local = sv;
  this_local = this;
  std::function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)>::function
            (&local_48,(function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)> *)sv);
  call<std::pair<char32_t,_char32_t>,_std::function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)>,_nullptr,_peg::SemanticValues_&>
            ((peg *)this,&local_48,(SemanticValues *)param_2_local);
  std::function<std::pair<char32_t,_char32_t>_(const_peg::SemanticValues_&)>::~function(&local_48);
  return (any)(placeholder *)this;
}

Assistant:

any operator()(SemanticValues& sv, any& /*dt*/) {
            return call<R>(fn_, sv);
        }